

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O3

alik_seas_object alik_seas_init(int p,int d,int q,int s,int P,int D,int Q,int N)

{
  uint uVar1;
  uint uVar2;
  alik_seas_object paVar3;
  uint uVar4;
  int iVar5;
  double dVar6;
  
  uVar4 = P * s + p;
  uVar1 = Q * s + 1 + q;
  uVar2 = uVar1;
  if (Q * s + q < (int)uVar4) {
    uVar2 = uVar4;
  }
  paVar3 = (alik_seas_object)malloc((long)(int)uVar2 * 0x10 + (long)N * 0x18 + 0x60);
  paVar3->p = p;
  paVar3->d = d;
  paVar3->q = q;
  paVar3->s = s;
  paVar3->P = P;
  paVar3->D = D;
  paVar3->Q = Q;
  paVar3->N = N;
  paVar3->length = N;
  iVar5 = q + p + P + Q;
  paVar3->pq = iVar5;
  paVar3->M = 0;
  if (D == 0 && d == 0) {
    paVar3->pq = iVar5 + 1;
    paVar3->M = 1;
  }
  if ((int)uVar1 < (int)uVar4) {
    uVar1 = uVar4;
  }
  paVar3->r = uVar1;
  paVar3->offset = uVar1 * 2;
  if (0 < (int)uVar1) {
    memset(paVar3->x,0,(ulong)uVar1 << 3);
    memset(paVar3->x + (int)uVar2,0,(ulong)uVar1 << 3);
  }
  dVar6 = macheps();
  paVar3->eps = dVar6;
  paVar3->mean = 0.0;
  return paVar3;
}

Assistant:

alik_seas_object alik_seas_init(int p, int d, int q, int s, int P, int D, int Q, int N) {
	alik_seas_object obj = NULL;
	int i,r, t;

	r = p + s*P;

	t = q + s*Q + 1;

	if (r < t) {
		r = t;
	}
	else {
		t = r;
	}

	obj = (alik_seas_object)malloc(sizeof(struct alik_seas_set) + sizeof(double) * 2 * r + sizeof(double)* 3 * N);

	obj->p = p;
	obj->d = d;
	obj->q = q;
	obj->s = s;
	obj->P = P;
	obj->D = D;
	obj->Q = Q;
	obj->N = N;
	obj->length = N;
	obj->pq = p + q + P + Q;

	obj->M = 0;

	if (d == 0 && D == 0) {
		obj->pq = obj->pq + 1;
		obj->M = 1;
	}

	obj->r = p + s * P;

	t = 1 + q + s*Q;
	if (obj->r < t) {
		obj->r = t;
	}
	t = obj->r;
	obj->offset = 2 * obj->r;

	for (i = 0; i < t; ++i) {
		obj->x[i] = 0.0;// phi
	}

	for (i = 0; i < t; ++i) {
		obj->x[i+r] = 0.0;//theta
	}
	obj->eps = macheps();
	obj->mean = 0.0;

	return obj;
}